

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O3

void __thiscall
DIS::ElectromagneticEmissionSystemData::marshal
          (ElectromagneticEmissionSystemData *this,DataStream *dataStream)

{
  undefined8 *puVar1;
  pointer pEVar2;
  ulong uVar3;
  long lVar4;
  ElectromagneticEmissionBeamData x;
  ElectromagneticEmissionBeamData local_b0;
  
  DataStream::operator<<(dataStream,this->_systemDataLength);
  DataStream::operator<<
            (dataStream,
             (uchar)((uint)(*(int *)&(this->_beamDataRecords).
                                     super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_beamDataRecords).
                                    super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 7));
  DataStream::operator<<(dataStream,this->_emissionsPadding2);
  EmitterSystem::marshal(&this->_emitterSystem,dataStream);
  Vector3Float::marshal(&this->_location,dataStream);
  pEVar2 = (this->_beamDataRecords).
           super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_beamDataRecords).
      super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar2) {
    lVar4 = 0x68;
    uVar3 = 0;
    do {
      local_b0._vptr_ElectromagneticEmissionBeamData =
           (_func_int **)&PTR__ElectromagneticEmissionBeamData_001b4360;
      local_b0._8_4_ = *(undefined4 *)((long)pEVar2 + lVar4 + -0x60);
      local_b0._fundamentalParameterData._vptr_EEFundamentalParameterData =
           (_func_int **)&PTR__EEFundamentalParameterData_001b42d0;
      local_b0._fundamentalParameterData._pulseWidth = *(float *)((long)pEVar2 + lVar4 + -0x40);
      puVar1 = (undefined8 *)((long)pEVar2 + lVar4 + -0x50);
      local_b0._fundamentalParameterData._8_8_ = *puVar1;
      local_b0._fundamentalParameterData._16_8_ = puVar1[1];
      local_b0._beamData._vptr_BeamData = (_func_int **)&PTR__BeamData_001b3b10;
      local_b0._beamData._beamSweepSync = *(float *)((long)pEVar2 + lVar4 + -0x20);
      puVar1 = (undefined8 *)((long)pEVar2 + lVar4 + -0x30);
      local_b0._beamData._8_8_ = *puVar1;
      local_b0._beamData._16_8_ = puVar1[1];
      local_b0._80_4_ = *(undefined4 *)((long)pEVar2 + lVar4 + -0x18);
      local_b0._jammingTechnique._vptr_JammingTechnique =
           (_func_int **)&PTR__JammingTechnique_001b5070;
      local_b0._jammingTechnique._8_4_ = *(undefined4 *)((long)pEVar2 + lVar4 + -8);
      std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::vector
                (&local_b0._trackJamTargets,
                 (vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_> *)
                 ((long)&pEVar2->_vptr_ElectromagneticEmissionBeamData + lVar4));
      ElectromagneticEmissionBeamData::marshal(&local_b0,dataStream);
      ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData(&local_b0);
      uVar3 = uVar3 + 1;
      pEVar2 = (this->_beamDataRecords).
               super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x80;
    } while (uVar3 < (ulong)((long)(this->_beamDataRecords).
                                   super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 7));
  }
  return;
}

Assistant:

void ElectromagneticEmissionSystemData::marshal(DataStream& dataStream) const
{
    dataStream << _systemDataLength;
    dataStream << ( unsigned char )_beamDataRecords.size();
    dataStream << _emissionsPadding2;
    _emitterSystem.marshal(dataStream);
    _location.marshal(dataStream);

    for(size_t idx = 0; idx < _beamDataRecords.size(); idx++)
    {
        ElectromagneticEmissionBeamData x = _beamDataRecords[idx];
        x.marshal(dataStream);
    }
}